

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_config.c
# Opt level: O0

int parse_sequence_header(uint8_t *buffer,size_t length,Av1Config *config)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_RDX;
  int film_grain_params_present;
  int enable_restoration;
  int enable_cdef;
  int enable_superres;
  int order_hint_bits_minus_1;
  int seq_force_integer_mv;
  int seq_choose_integer_mv;
  int seq_force_screen_content_tools_val;
  int seq_choose_screen_content_tools;
  int seq_force_screen_content_tools;
  int SELECT_SCREEN_CONTENT_TOOLS;
  int enable_ref_frame_mvs;
  int enable_dist_wtd_comp;
  int enable_order_hint;
  int enable_dual_filter;
  int enable_warped_motion;
  int enable_masked_compound;
  int enable_interintra_compound;
  int enable_intra_edge_filter;
  int enable_filter_intra;
  int use_128x128_superblock;
  int additional_frame_id_length_minus_1;
  int delta_frame_id_length_minus_2;
  int frame_id_numbers_present_flag;
  uint8_t frame_id_numbers_present;
  int max_frame_height_minus_1;
  int max_frame_width_minus_1;
  int frame_height_bits_minus_1;
  int frame_width_bits_minus_1;
  int initial_presentation_delay_minus_1;
  int initial_presentation_delay_present_for_this_op;
  int decoder_model_present_for_op;
  int seq_tier_this_op;
  int seq_tier;
  int seq_level_idx;
  int operating_point_idc;
  int op_index;
  int num_operating_points;
  int operating_points_cnt_minus_1;
  int initial_presentation_delay_present;
  int decoder_model_info_present_flag;
  int timing_info_present_flag;
  int buffer_delay_length;
  int has_decoder_model;
  int seq_level_idx_0;
  int reduced_still_picture_header;
  int still_picture;
  int seq_profile;
  aom_read_bit_buffer *reader;
  aom_read_bit_buffer reader_instance;
  int result;
  int in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  uint in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int iVar5;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  uint in_stack_ffffffffffffff48;
  undefined1 local_94;
  int local_88;
  int local_4;
  
  iVar2 = aom_rb_read_literal((aom_read_bit_buffer *)
                              CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                              in_stack_fffffffffffffeec);
  *(char *)(in_RDX + 2) = (char)iVar2;
  aom_rb_read_bit((aom_read_bit_buffer *)
                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  iVar2 = aom_rb_read_bit((aom_read_bit_buffer *)
                          CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  if (iVar2 == 0) {
    bVar1 = false;
    iVar3 = aom_rb_read_bit((aom_read_bit_buffer *)
                            CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if (iVar3 != 0) {
      iVar3 = parse_timing_info((aom_read_bit_buffer *)
                                CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      if (iVar3 != 0) {
        return -1;
      }
      iVar3 = aom_rb_read_bit((aom_read_bit_buffer *)
                              CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      if ((iVar3 != 0) &&
         (iVar3 = parse_decoder_model_info
                            ((aom_read_bit_buffer *)
                             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
         iVar3 == -1)) {
        return -1;
      }
      bVar1 = true;
    }
    iVar3 = aom_rb_read_bit((aom_read_bit_buffer *)
                            CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    *(char *)(in_RDX + 0xb) = (char)iVar3;
    iVar3 = aom_rb_read_literal((aom_read_bit_buffer *)
                                CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                in_stack_fffffffffffffeec);
    for (local_88 = 0; local_88 < iVar3 + 1; local_88 = local_88 + 1) {
      aom_rb_read_literal((aom_read_bit_buffer *)
                          CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          in_stack_fffffffffffffeec);
      iVar4 = aom_rb_read_literal((aom_read_bit_buffer *)
                                  CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                  in_stack_fffffffffffffeec);
      local_94 = 0;
      if (7 < iVar4) {
        iVar5 = aom_rb_read_bit((aom_read_bit_buffer *)
                                CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        local_94 = (undefined1)iVar5;
      }
      if (((bVar1) &&
          (iVar5 = aom_rb_read_bit((aom_read_bit_buffer *)
                                   CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)),
          iVar5 != 0)) &&
         (iVar5 = parse_operating_parameters_info
                            ((aom_read_bit_buffer *)
                             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                             in_stack_ffffffffffffff04), iVar5 == -1)) {
        return -1;
      }
      if ((*(char *)(in_RDX + 0xb) != '\0') &&
         (iVar5 = aom_rb_read_bit((aom_read_bit_buffer *)
                                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)),
         iVar5 != 0)) {
        aom_rb_read_literal((aom_read_bit_buffer *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            in_stack_fffffffffffffeec);
      }
      if (local_88 == 0) {
        *(char *)(in_RDX + 3) = (char)iVar4;
        *(undefined1 *)(in_RDX + 4) = local_94;
        *(undefined1 *)(in_RDX + 0xb) = 0;
        *(undefined1 *)(in_RDX + 0xc) = 0;
      }
    }
  }
  else {
    *(undefined1 *)(in_RDX + 0xb) = 0;
    iVar3 = aom_rb_read_literal((aom_read_bit_buffer *)
                                CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                in_stack_fffffffffffffeec);
    *(char *)(in_RDX + 3) = (char)iVar3;
    *(undefined1 *)(in_RDX + 4) = 0;
  }
  aom_rb_read_literal((aom_read_bit_buffer *)
                      CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      in_stack_fffffffffffffeec);
  aom_rb_read_literal((aom_read_bit_buffer *)
                      CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      in_stack_fffffffffffffeec);
  aom_rb_read_literal((aom_read_bit_buffer *)
                      CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      in_stack_fffffffffffffeec);
  iVar3 = aom_rb_read_literal((aom_read_bit_buffer *)
                              CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                              in_stack_fffffffffffffeec);
  in_stack_ffffffffffffff48 = in_stack_ffffffffffffff48 & 0xffffff;
  if (iVar2 == 0) {
    in_stack_ffffffffffffff44 =
         aom_rb_read_bit((aom_read_bit_buffer *)
                         CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    in_stack_ffffffffffffff48 =
         CONCAT13((char)in_stack_ffffffffffffff44,(int3)in_stack_ffffffffffffff48);
  }
  if ((char)(in_stack_ffffffffffffff48 >> 0x18) != '\0') {
    in_stack_ffffffffffffff40 =
         aom_rb_read_literal((aom_read_bit_buffer *)
                             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                             in_stack_fffffffffffffeec);
    aom_rb_read_literal((aom_read_bit_buffer *)
                        CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                        in_stack_fffffffffffffeec);
  }
  aom_rb_read_bit((aom_read_bit_buffer *)
                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  aom_rb_read_bit((aom_read_bit_buffer *)
                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  aom_rb_read_bit((aom_read_bit_buffer *)
                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  if (iVar2 == 0) {
    aom_rb_read_bit((aom_read_bit_buffer *)
                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    aom_rb_read_bit((aom_read_bit_buffer *)
                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    aom_rb_read_bit((aom_read_bit_buffer *)
                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    aom_rb_read_bit((aom_read_bit_buffer *)
                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    iVar2 = aom_rb_read_bit((aom_read_bit_buffer *)
                            CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if (iVar2 != 0) {
      aom_rb_read_bit((aom_read_bit_buffer *)
                      CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      aom_rb_read_bit((aom_read_bit_buffer *)
                      CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    }
    iVar5 = 2;
    iVar4 = aom_rb_read_bit((aom_read_bit_buffer *)
                            CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if (iVar4 == 0) {
      iVar5 = aom_rb_read_bit((aom_read_bit_buffer *)
                              CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    }
    if ((0 < iVar5) &&
       (iVar4 = aom_rb_read_bit((aom_read_bit_buffer *)
                                CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)),
       iVar4 == 0)) {
      in_stack_fffffffffffffefc =
           aom_rb_read_bit((aom_read_bit_buffer *)(ulong)in_stack_fffffffffffffef8);
    }
    if (iVar2 != 0) {
      in_stack_fffffffffffffef8 =
           aom_rb_read_literal((aom_read_bit_buffer *)
                               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                               in_stack_fffffffffffffeec);
    }
  }
  aom_rb_read_bit((aom_read_bit_buffer *)
                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  aom_rb_read_bit((aom_read_bit_buffer *)
                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  aom_rb_read_bit((aom_read_bit_buffer *)
                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  iVar2 = parse_color_config((aom_read_bit_buffer *)CONCAT44(iVar3,in_stack_ffffffffffffff48),
                             (Av1Config *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  if (iVar2 == 0) {
    aom_rb_read_bit((aom_read_bit_buffer *)
                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_4 = 0;
  }
  else {
    fprintf(_stderr,"av1c: color_config() parse failed.\n");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int parse_sequence_header(const uint8_t *const buffer, size_t length,
                                 Av1Config *config) {
  int result = 0;
  // The reader instance is local to this function, but a pointer to the
  // reader instance is used within this function and throughout this file to
  // allow use of the helper macros that reduce parse error checking verbosity.
  struct aom_read_bit_buffer reader_instance = { buffer, buffer + length, 0,
                                                 &result,
                                                 bitreader_error_handler };
  struct aom_read_bit_buffer *reader = &reader_instance;

  AV1C_READ_BITS_OR_RETURN_ERROR(seq_profile, 3);
  config->seq_profile = seq_profile;
  AV1C_READ_BIT_OR_RETURN_ERROR(still_picture);
  AV1C_READ_BIT_OR_RETURN_ERROR(reduced_still_picture_header);
  if (reduced_still_picture_header) {
    config->initial_presentation_delay_present = 0;
    AV1C_READ_BITS_OR_RETURN_ERROR(seq_level_idx_0, 5);
    config->seq_level_idx_0 = seq_level_idx_0;
    config->seq_tier_0 = 0;
  } else {
    int has_decoder_model = 0;
    int buffer_delay_length = 0;

    AV1C_READ_BIT_OR_RETURN_ERROR(timing_info_present_flag);
    if (timing_info_present_flag) {
      if (parse_timing_info(reader) != 0) return -1;

      AV1C_READ_BIT_OR_RETURN_ERROR(decoder_model_info_present_flag);
      if (decoder_model_info_present_flag &&
          (buffer_delay_length = parse_decoder_model_info(reader)) == -1) {
        return -1;
      }
      has_decoder_model = 1;
    }

    AV1C_READ_BIT_OR_RETURN_ERROR(initial_presentation_delay_present);
    config->initial_presentation_delay_present =
        initial_presentation_delay_present;

    AV1C_READ_BITS_OR_RETURN_ERROR(operating_points_cnt_minus_1, 5);
    const int num_operating_points = operating_points_cnt_minus_1 + 1;

    for (int op_index = 0; op_index < num_operating_points; ++op_index) {
      AV1C_READ_BITS_OR_RETURN_ERROR(operating_point_idc, 12);
      AV1C_READ_BITS_OR_RETURN_ERROR(seq_level_idx, 5);

      int seq_tier = 0;
      if (seq_level_idx > 7) {
        AV1C_READ_BIT_OR_RETURN_ERROR(seq_tier_this_op);
        seq_tier = seq_tier_this_op;
      }

      if (has_decoder_model) {
        AV1C_READ_BIT_OR_RETURN_ERROR(decoder_model_present_for_op);
        if (decoder_model_present_for_op) {
          if (parse_operating_parameters_info(reader, buffer_delay_length) ==
              -1) {
            return -1;
          }
        }
      }

      if (config->initial_presentation_delay_present) {
        // Skip the initial presentation delay bits if present since this
        // function has no access to the data required to properly set the
        // field.
        AV1C_READ_BIT_OR_RETURN_ERROR(
            initial_presentation_delay_present_for_this_op);
        if (initial_presentation_delay_present_for_this_op) {
          AV1C_READ_BITS_OR_RETURN_ERROR(initial_presentation_delay_minus_1, 4);
        }
      }

      if (op_index == 0) {
        // Av1Config needs only the values from the first operating point.
        config->seq_level_idx_0 = seq_level_idx;
        config->seq_tier_0 = seq_tier;
        config->initial_presentation_delay_present = 0;
        config->initial_presentation_delay_minus_one = 0;
      }
    }
  }

  AV1C_READ_BITS_OR_RETURN_ERROR(frame_width_bits_minus_1, 4);
  AV1C_READ_BITS_OR_RETURN_ERROR(frame_height_bits_minus_1, 4);
  AV1C_READ_BITS_OR_RETURN_ERROR(max_frame_width_minus_1,
                                 frame_width_bits_minus_1 + 1);
  AV1C_READ_BITS_OR_RETURN_ERROR(max_frame_height_minus_1,
                                 frame_height_bits_minus_1 + 1);

  uint8_t frame_id_numbers_present = 0;
  if (!reduced_still_picture_header) {
    AV1C_READ_BIT_OR_RETURN_ERROR(frame_id_numbers_present_flag);
    frame_id_numbers_present = frame_id_numbers_present_flag;
  }

  if (frame_id_numbers_present) {
    AV1C_READ_BITS_OR_RETURN_ERROR(delta_frame_id_length_minus_2, 4);
    AV1C_READ_BITS_OR_RETURN_ERROR(additional_frame_id_length_minus_1, 3);
  }

  AV1C_READ_BIT_OR_RETURN_ERROR(use_128x128_superblock);
  AV1C_READ_BIT_OR_RETURN_ERROR(enable_filter_intra);
  AV1C_READ_BIT_OR_RETURN_ERROR(enable_intra_edge_filter);

  if (!reduced_still_picture_header) {
    AV1C_READ_BIT_OR_RETURN_ERROR(enable_interintra_compound);
    AV1C_READ_BIT_OR_RETURN_ERROR(enable_masked_compound);
    AV1C_READ_BIT_OR_RETURN_ERROR(enable_warped_motion);
    AV1C_READ_BIT_OR_RETURN_ERROR(enable_dual_filter);

    AV1C_READ_BIT_OR_RETURN_ERROR(enable_order_hint);
    if (enable_order_hint) {
      AV1C_READ_BIT_OR_RETURN_ERROR(enable_dist_wtd_comp);
      AV1C_READ_BIT_OR_RETURN_ERROR(enable_ref_frame_mvs);
    }

    const int SELECT_SCREEN_CONTENT_TOOLS = 2;
    int seq_force_screen_content_tools = SELECT_SCREEN_CONTENT_TOOLS;
    AV1C_READ_BIT_OR_RETURN_ERROR(seq_choose_screen_content_tools);
    if (!seq_choose_screen_content_tools) {
      AV1C_READ_BIT_OR_RETURN_ERROR(seq_force_screen_content_tools_val);
      seq_force_screen_content_tools = seq_force_screen_content_tools_val;
    }

    if (seq_force_screen_content_tools > 0) {
      AV1C_READ_BIT_OR_RETURN_ERROR(seq_choose_integer_mv);

      if (!seq_choose_integer_mv) {
        AV1C_READ_BIT_OR_RETURN_ERROR(seq_force_integer_mv);
      }
    }

    if (enable_order_hint) {
      AV1C_READ_BITS_OR_RETURN_ERROR(order_hint_bits_minus_1, 3);
    }
  }

  AV1C_READ_BIT_OR_RETURN_ERROR(enable_superres);
  AV1C_READ_BIT_OR_RETURN_ERROR(enable_cdef);
  AV1C_READ_BIT_OR_RETURN_ERROR(enable_restoration);

  if (parse_color_config(reader, config) != 0) {
    fprintf(stderr, "av1c: color_config() parse failed.\n");
    return -1;
  }

  AV1C_READ_BIT_OR_RETURN_ERROR(film_grain_params_present);
  return 0;
}